

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

ConvexH * ConvexDecomposition::ConvexHCrop(ConvexH *convex,Plane *slice)

{
  Array<ConvexDecomposition::Plane> *this;
  ulong uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  Coplanar CVar8;
  undefined8 uVar9;
  uint vertices_size;
  uint uVar10;
  uint uVar11;
  long lVar12;
  float fVar13;
  byte bVar14;
  short sVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  float3 *pfVar21;
  HalfEdge *pHVar22;
  HalfEdge *pHVar23;
  HalfEdge *pHVar24;
  Plane *pPVar25;
  Plane *pPVar26;
  ConvexH *this_00;
  float3 *pfVar27;
  short sVar28;
  Coplanar *pCVar29;
  int iVar30;
  uint i;
  long lVar31;
  Array<ConvexDecomposition::ConvexH::HalfEdge> *pAVar32;
  ulong uVar33;
  uchar uVar34;
  uchar uVar35;
  int iVar36;
  float3 fVar37;
  short asStack_31436 [95685];
  int local_28ac;
  uint local_28a0;
  uint local_289c;
  int local_2874;
  Array<ConvexDecomposition::float3> createdverts;
  VertFlag vertflag [256];
  HalfEdge tmpunderedges [512];
  Coplanar coplanaredges [512];
  EdgeFlag edgeflag [512];
  Plane tmpunderplanes [128];
  
  if ((ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::vertscoplanar
       == '\0') &&
     (iVar16 = __cxa_guard_acquire(&ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)
                                    ::vertscoplanar), iVar16 != 0)) {
    ConvexHCrop::vertscoplanar = (Array<int>)(ZEXT816(0) << 0x40);
    __cxa_atexit(Array<int>::~Array,&ConvexHCrop::vertscoplanar,&__dso_handle);
    __cxa_guard_release(&ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)
                         ::vertscoplanar);
  }
  ConvexHCrop::vertscoplanar.count = 0;
  if ((ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::edgesplit ==
       '\0') &&
     (iVar16 = __cxa_guard_acquire(&ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)
                                    ::edgesplit), iVar16 != 0)) {
    ConvexHCrop::edgesplit = (Array<int>)(ZEXT816(0) << 0x40);
    __cxa_atexit(Array<int>::~Array,&ConvexHCrop::edgesplit,&__dso_handle);
    __cxa_guard_release(&ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)
                         ::edgesplit);
  }
  ConvexHCrop::edgesplit.count = 0;
  if (0x1df < (convex->edges).count) {
    __assert_fail("convex.edges.count<480",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x745,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
  }
  pAVar32 = &convex->edges;
  memset(tmpunderplanes,0,0x800);
  uVar34 = '\0';
  uVar17 = 0;
  createdverts.element = (float3 *)0x0;
  createdverts.count = 0;
  createdverts.array_size = 0;
  for (lVar31 = 0; lVar31 < (convex->vertices).count; lVar31 = lVar31 + 1) {
    pfVar21 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(int)lVar31);
    iVar16 = PlaneTest(slice,pfVar21);
    vertflag[lVar31].planetest = (uchar)iVar16;
    if (iVar16 == 2) {
      vertflag[lVar31].overmap = uVar34;
      vertflag[lVar31].undermap = 0xff;
      uVar34 = uVar34 + '\x01';
    }
    else {
      if (iVar16 == 1) {
        vertflag[lVar31].undermap = (uchar)uVar17;
        uVar35 = uVar34;
      }
      else {
        uVar35 = uVar34 + '\x01';
        vertflag[lVar31].undermap = (uchar)uVar17;
        vertflag[lVar31].overmap = uVar34;
      }
      uVar17 = uVar17 + 1;
      uVar34 = uVar35;
    }
  }
  this = &convex->facets;
  i = 0;
  local_28ac = 0;
  iVar16 = 0;
  uVar11 = 0;
  uVar10 = 0;
  vertices_size = uVar17;
  do {
    if ((convex->facets).count <= (int)i) {
      iVar20 = iVar16;
      if (0 < (int)uVar10) {
        iVar20 = iVar16 + 1;
        fVar13 = (slice->normal).y;
        uVar9 = *(undefined8 *)&(slice->normal).z;
        tmpunderplanes[iVar16].normal.x = (slice->normal).x;
        tmpunderplanes[iVar16].normal.y = fVar13;
        *(undefined8 *)&tmpunderplanes[iVar16].normal.z = uVar9;
      }
      uVar17 = 1;
      if (1 < (int)uVar10) {
        uVar17 = uVar10;
      }
      iVar16 = 2;
      pCVar29 = coplanaredges;
      uVar33 = 0;
      while (pCVar29 = pCVar29 + 1, uVar33 != uVar17 - 1) {
        uVar1 = uVar33 + 1;
        if (coplanaredges[uVar33].v1 != coplanaredges[uVar33 + 1].v0) {
          lVar31 = 0;
          do {
            if ((int)uVar10 <= iVar16 + (int)lVar31) {
              __assert_fail("j<coplanaredges_num",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x848,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            lVar2 = lVar31 + 1;
            lVar12 = lVar31 + 1;
            lVar31 = lVar2;
          } while (coplanaredges[uVar33].v1 != pCVar29[lVar12].v0);
          CVar8 = coplanaredges[uVar1];
          coplanaredges[uVar1] = pCVar29[lVar2];
          pCVar29[lVar2] = CVar8;
        }
        iVar16 = iVar16 + 1;
        uVar33 = uVar1;
      }
      this_00 = (ConvexH *)::operator_new(0x30);
      ConvexH::ConvexH(this_00,vertices_size,uVar10 + uVar11,iVar20);
      iVar16 = 0;
      for (lVar31 = 0; lVar31 < (convex->vertices).count; lVar31 = lVar31 + 1) {
        if (vertflag[lVar31].planetest != '\x02') {
          pfVar21 = Array<ConvexDecomposition::float3>::operator[](&convex->vertices,(int)lVar31);
          pfVar27 = Array<ConvexDecomposition::float3>::operator[]
                              ((Array<ConvexDecomposition::float3> *)this_00,iVar16);
          fVar13 = pfVar21->y;
          pfVar27->x = pfVar21->x;
          pfVar27->y = fVar13;
          pfVar27->z = pfVar21->z;
          iVar16 = iVar16 + 1;
        }
      }
      for (iVar36 = 0; iVar16 + iVar36 < (int)vertices_size; iVar36 = iVar36 + 1) {
        pfVar21 = Array<ConvexDecomposition::float3>::operator[](&createdverts,iVar36);
        pfVar27 = Array<ConvexDecomposition::float3>::operator[]
                            ((Array<ConvexDecomposition::float3> *)this_00,iVar16 + iVar36);
        fVar13 = pfVar21->y;
        pfVar27->x = pfVar21->x;
        pfVar27->y = fVar13;
        pfVar27->z = pfVar21->z;
      }
      if (createdverts.count != iVar36) {
        __assert_fail("i==createdverts.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x859,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
      }
      pAVar32 = &this_00->edges;
      uVar17 = uVar11;
      for (uVar33 = 0; (~((int)uVar10 >> 0x1f) & uVar10) != uVar33; uVar33 = uVar33 + 1) {
        pHVar22 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,uVar17);
        pHVar22->p = (char)iVar20 + 0xff;
        uVar7 = coplanaredges[uVar33].ea;
        pHVar22 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,uVar17);
        pHVar22->ea = uVar7;
        tmpunderedges[uVar7].ea = (short)uVar17;
        uVar34 = coplanaredges[uVar33].v0;
        pHVar22 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,uVar17);
        pHVar22->v = uVar34;
        uVar17 = uVar17 + 1;
      }
      memcpy((this_00->edges).element,tmpunderedges,(long)(int)uVar11 << 2);
      memcpy((this_00->facets).element,tmpunderplanes,(long)iVar20 << 4);
      Array<ConvexDecomposition::float3>::~Array(&createdverts);
      return this_00;
    }
    bVar14 = 0;
    local_28a0 = 0xffffffff;
    uVar19 = 0xffffffff;
    local_2874 = 0;
    iVar20 = local_28ac;
    local_289c = local_28a0;
    do {
      iVar30 = iVar20 + 1;
      iVar36 = local_28ac;
      if ((iVar30 < (convex->edges).count) &&
         (pHVar22 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar30),
         i == pHVar22->p)) {
        iVar36 = iVar30;
        iVar30 = local_2874;
      }
      local_2874 = iVar30;
      pHVar22 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar20);
      pHVar23 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar36);
      pHVar24 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,(int)pHVar22->ea);
      bVar3 = pHVar22->v;
      bVar4 = pHVar23->v;
      bVar5 = vertflag[bVar3].planetest;
      bVar6 = vertflag[bVar4].planetest;
      bVar14 = bVar14 | bVar5;
      if ((bVar5 == 2) && (bVar6 == 2)) {
        edgeflag[iVar20].undermap = -1;
      }
      else {
        sVar28 = (short)uVar11;
        uVar34 = (uchar)iVar16;
        if ((bVar6 | bVar5) == 0) {
          iVar30 = iVar36 + 1;
          if (((convex->edges).count <= iVar30) ||
             (pHVar24 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar30),
             i != pHVar24->p)) {
            iVar30 = local_28ac;
          }
          pHVar24 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar30);
          if (i != pHVar24->p) {
            __assert_fail("convex.edges[e2].p==currentplane",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x79a,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          pHVar24 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar30);
          if (vertflag[pHVar24->v].planetest == '\x01') {
            edgeflag[iVar20].undermap = sVar28;
            local_28a0 = (uint)vertflag[pHVar22->v].undermap;
            tmpunderedges[(int)uVar11].v = vertflag[pHVar22->v].undermap;
            tmpunderedges[(int)uVar11].p = uVar34;
            tmpunderedges[(int)uVar11].ea = -1;
            uVar19 = (uint)vertflag[pHVar23->v].undermap;
            local_289c = uVar11;
            uVar11 = uVar11 + 1;
          }
          else {
            edgeflag[iVar20].undermap = -1;
          }
        }
        else if ((bVar6 | bVar5) == 1) {
          tmpunderedges[(int)uVar11].v = vertflag[bVar3].undermap;
          edgeflag[iVar20].undermap = sVar28;
          tmpunderedges[(int)uVar11].p = uVar34;
          if (pHVar22->ea < iVar20) {
            sVar15 = edgeflag[(int)pHVar22->ea].undermap;
            if ((long)sVar15 == -1) {
              __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x78d,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            tmpunderedges[(int)uVar11].ea = sVar15;
            tmpunderedges[sVar15].ea = sVar28;
          }
LAB_00e2920c:
          uVar11 = uVar11 + 1;
        }
        else if ((bVar5 == 1) && (bVar6 == 2)) {
          tmpunderedges[(int)uVar11].v = vertflag[bVar3].undermap;
          edgeflag[iVar20].undermap = sVar28;
          tmpunderedges[(int)uVar11].p = uVar34;
          if (pHVar22->ea < iVar20) {
            lVar31 = (long)edgeflag[(int)pHVar22->ea].undermap;
            if (lVar31 == -1) {
              __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x7b3,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            tmpunderedges[(int)uVar11].ea = edgeflag[(int)pHVar22->ea].undermap;
            tmpunderedges[lVar31].ea = sVar28;
            local_28a0 = (uint)tmpunderedges[lVar31].v;
            uVar18 = vertices_size;
          }
          else {
            pPVar26 = Array<ConvexDecomposition::Plane>::operator[](this,(uint)pHVar22->p);
            pPVar25 = Array<ConvexDecomposition::Plane>::operator[](this,(uint)pHVar24->p);
            fVar37 = ThreePlaneIntersection(pPVar26,pPVar25,slice);
            Array<ConvexDecomposition::float3>::Add(&createdverts,fVar37);
            uVar18 = vertices_size + 1;
            local_28a0 = vertices_size;
          }
          tmpunderedges[(long)(int)uVar11 + 1].v = (uchar)local_28a0;
          tmpunderedges[(long)(int)uVar11 + 1].p = uVar34;
          tmpunderedges[(long)(int)uVar11 + 1].ea = -1;
          local_289c = uVar11 + 1;
          vertices_size = uVar18;
          uVar11 = uVar11 + 2;
        }
        else if (bVar5 == 0) {
          if (bVar6 != 2) goto LAB_00e299a0;
          edgeflag[iVar20].undermap = -1;
          if (i != pHVar22->p) {
            __assert_fail("edge0.p == currentplane",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x7d9,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          bVar3 = vertflag[bVar3].undermap;
          local_28a0 = (uint)bVar3;
          for (iVar20 = local_28ac; ((bVar14 & 1) == 0 && (iVar20 < (convex->edges).count));
              iVar20 = iVar20 + 1) {
            pHVar23 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar20);
            if (pHVar23->p != pHVar22->p) goto LAB_00e29670;
            pHVar23 = Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](pAVar32,iVar20);
            bVar14 = bVar14 | vertflag[pHVar23->v].planetest;
          }
          if ((bVar14 & 1) != 0) {
            tmpunderedges[(int)uVar11].v = bVar3;
            tmpunderedges[(int)uVar11].p = uVar34;
            tmpunderedges[(int)uVar11].ea = -1;
            local_289c = uVar11;
            goto LAB_00e2920c;
          }
        }
        else {
          if (bVar5 != 2) {
LAB_00e299a0:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x81b,
                          "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
          }
          if (bVar6 == 0) {
            edgeflag[iVar20].undermap = -1;
            uVar19 = (uint)vertflag[bVar4].undermap;
          }
          else {
            if (bVar6 != 1) goto LAB_00e299a0;
            if (uVar19 != 0xffffffff) {
              __assert_fail("vin==-1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x7ea,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            sVar15 = pHVar22->ea;
            iVar30 = (int)sVar15;
            if (iVar20 < iVar30) {
              pPVar26 = Array<ConvexDecomposition::Plane>::operator[](this,(uint)pHVar22->p);
              pPVar25 = Array<ConvexDecomposition::Plane>::operator[](this,(uint)pHVar24->p);
              fVar37 = ThreePlaneIntersection(pPVar26,pPVar25,slice);
              Array<ConvexDecomposition::float3>::Add(&createdverts,fVar37);
              sVar15 = pHVar22->ea;
              iVar30 = (int)sVar15;
              uVar19 = vertices_size;
              vertices_size = vertices_size + 1;
            }
            else {
              lVar31 = (long)edgeflag[sVar15].undermap;
              if (tmpunderedges[lVar31].p != tmpunderedges[lVar31 + 1].p) {
                __assert_fail("tmpunderedges[nea].p==tmpunderedges[nea+1].p",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x7f6,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              bVar3 = tmpunderedges[lVar31 + 1].v;
              uVar19 = (uint)bVar3;
              if ((int)vertices_size <= (int)(uint)bVar3) {
                __assert_fail("vin < vertcountunder",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x7f8,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              if ((int)(uint)bVar3 < (int)uVar17) {
                __assert_fail("vin >= vertcountunderold",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x7f9,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
            }
            tmpunderedges[(int)uVar11].v = (uchar)uVar19;
            tmpunderedges[(int)uVar11].p = uVar34;
            edgeflag[iVar20].undermap = sVar28;
            if (iVar30 < iVar20) {
              sVar15 = edgeflag[sVar15].undermap;
              if ((long)sVar15 == -1) {
                __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x805,
                              "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)")
                ;
              }
              tmpunderedges[(int)uVar11].ea = sVar15;
              tmpunderedges[sVar15].ea = sVar28;
            }
            if ((int)sVar28 != uVar11) {
              __assert_fail("edgeflag[e0].undermap == under_edge_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x80a,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            uVar11 = uVar11 + 1;
          }
        }
      }
LAB_00e29670:
      iVar20 = iVar36;
    } while (iVar36 != local_28ac);
    if ((bVar14 & 1) != 0) {
      pPVar26 = Array<ConvexDecomposition::Plane>::operator[](this,i);
      fVar13 = (pPVar26->normal).y;
      uVar9 = *(undefined8 *)&(pPVar26->normal).z;
      iVar20 = iVar16 + 1;
      tmpunderplanes[iVar16].normal.x = (pPVar26->normal).x;
      tmpunderplanes[iVar16].normal.y = fVar13;
      *(undefined8 *)&tmpunderplanes[iVar16].normal.z = uVar9;
      iVar16 = iVar20;
      if (-1 < (int)local_28a0) {
        if ((int)uVar19 < 0) {
          __assert_fail("vin>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82d,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        if ((int)local_289c < 0) {
          __assert_fail("coplanaredge>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82e,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        if (local_289c == 0x1ff) {
          __assert_fail("coplanaredge!=511",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82f,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        coplanaredges[(int)uVar10].ea = (unsigned_short)local_289c;
        coplanaredges[(int)uVar10].v0 = (uchar)uVar19;
        coplanaredges[(int)uVar10].v1 = (uchar)local_28a0;
        uVar10 = uVar10 + 1;
      }
    }
    local_28ac = local_2874;
    i = i + 1;
  } while( true );
}

Assistant:

ConvexH *ConvexHCrop(ConvexH &convex,const Plane &slice)
{
	int i;
	int vertcountunder=0;
	int vertcountover =0;
	static Array<int> vertscoplanar;  // existing vertex members of convex that are coplanar
	vertscoplanar.count=0;
	static Array<int> edgesplit;  // existing edges that members of convex that cross the splitplane
	edgesplit.count=0;

	assert(convex.edges.count<480);

	EdgeFlag  edgeflag[512];
	VertFlag  vertflag[256];
	PlaneFlag planeflag[128];
	HalfEdge  tmpunderedges[512];
	Plane	  tmpunderplanes[128];
	Coplanar coplanaredges[512];
	int coplanaredges_num=0;

	Array<REAL3> createdverts;
	// do the side-of-plane tests
	for(i=0;i<convex.vertices.count;i++) {
		vertflag[i].planetest = PlaneTest(slice,convex.vertices[i]);
		if(vertflag[i].planetest == COPLANAR) {
			// ? vertscoplanar.Add(i);
			vertflag[i].undermap = vertcountunder++;
			vertflag[i].overmap  = vertcountover++;
		}
		else if(vertflag[i].planetest == UNDER)	{
			vertflag[i].undermap = vertcountunder++;
		}
		else {
			assert(vertflag[i].planetest == OVER);
			vertflag[i].overmap  = vertcountover++;
			vertflag[i].undermap = 255; // for debugging purposes
		}
	}
	int vertcountunderold = vertcountunder; // for debugging only

	int under_edge_count =0;
	int underplanescount=0;
	int e0=0;

	for(int currentplane=0; currentplane<convex.facets.count; currentplane++) {
		int estart =e0;
		int enextface = 0;
		int planeside = 0;
		int e1 = e0+1;
		int vout=-1;
		int vin =-1;
		int coplanaredge = -1;
		do{

			if(e1 >= convex.edges.count || convex.edges[e1].p!=currentplane) {
				enextface = e1;
				e1=estart;
			}
			HalfEdge &edge0 = convex.edges[e0];
			HalfEdge &edge1 = convex.edges[e1];
			HalfEdge &edgea = convex.edges[edge0.ea];


			planeside |= vertflag[edge0.v].planetest;
			//if((vertflag[edge0.v].planetest & vertflag[edge1.v].planetest)  == COPLANAR) {
			//	assert(ecop==-1);
			//	ecop=e;
			//}


			if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == OVER){
				// both endpoints over plane
				edgeflag[e0].undermap  = -1;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == UNDER) {
				// at least one endpoint under, the other coplanar or under
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					// connect the neighbors
					assert(edgeflag[edge0.ea].undermap !=-1);
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				under_edge_count++;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == COPLANAR) {
				// both endpoints coplanar 
				// must check a 3rd point to see if UNDER
				int e2 = e1+1;
				if(e2>=convex.edges.count || convex.edges[e2].p!=currentplane) {
					e2 = estart;
				}
				assert(convex.edges[e2].p==currentplane);
				HalfEdge &edge2 = convex.edges[e2];
				if(vertflag[edge2.v].planetest==UNDER) {
					
					edgeflag[e0].undermap = under_edge_count;
					tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					// make sure this edge is added to the "coplanar" list
					coplanaredge = under_edge_count;
					vout = vertflag[edge0.v].undermap;
					vin  = vertflag[edge1.v].undermap;
					under_edge_count++;
				}
				else {
					edgeflag[e0].undermap = -1;
				}
			}
			else if(vertflag[edge0.v].planetest == UNDER && vertflag[edge1.v].planetest == OVER) {
				// first is under 2nd is over 
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
					vout = tmpunderedges[edgeflag[edge0.ea].undermap].v;
				}
				else {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					vout = vertcountunder++;
				}
				under_edge_count++;
				/// hmmm something to think about: i might be able to output this edge regarless of 
				// wheter or not we know v-in yet.  ok i;ll try this now:
				tmpunderedges[under_edge_count].v = vout;
				tmpunderedges[under_edge_count].p = underplanescount;
				tmpunderedges[under_edge_count].ea = -1;
				coplanaredge = under_edge_count;
				under_edge_count++;

				if(vin!=-1) {
					// we previously processed an edge  where we came under
					// now we know about vout as well

					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else if(vertflag[edge0.v].planetest == COPLANAR && vertflag[edge1.v].planetest == OVER) {
				// first is coplanar 2nd is over 
				
				edgeflag[e0].undermap = -1;
				vout = vertflag[edge0.v].undermap;
				// I hate this but i have to make sure part of this face is UNDER before ouputting this vert
				int k=estart;
				assert(edge0.p == currentplane);
				while(!(planeside&UNDER) && k<convex.edges.count && convex.edges[k].p==edge0.p) {
					planeside |= vertflag[convex.edges[k].v].planetest;
					k++;
				}
				if(planeside&UNDER){
					tmpunderedges[under_edge_count].v = vout;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					coplanaredge = under_edge_count; // hmmm should make a note of the edge # for later on
					under_edge_count++;
					
				}
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == UNDER) {
				// first is over next is under 
				// new vertex!!!
				assert(vin==-1);
				if(e0<edge0.ea) {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					vin = vertcountunder++;
				}
				else {
					// find the new vertex that was created by edge[edge0.ea]
					int nea = edgeflag[edge0.ea].undermap;
					assert(tmpunderedges[nea].p==tmpunderedges[nea+1].p);
					vin = tmpunderedges[nea+1].v;
					assert(vin < vertcountunder);
					assert(vin >= vertcountunderold);   // for debugging only
				}
				if(vout!=-1) {
					// we previously processed an edge  where we went over
					// now we know vin too
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}
				// output edge
				tmpunderedges[under_edge_count].v = vin;
				tmpunderedges[under_edge_count].p = underplanescount;
				edgeflag[e0].undermap = under_edge_count;
				if(e0>edge0.ea) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				assert(edgeflag[e0].undermap == under_edge_count);
				under_edge_count++;
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == COPLANAR) {
				// first is over next is coplanar 
				
				edgeflag[e0].undermap = -1;
				vin = vertflag[edge1.v].undermap;
				assert(vin!=-1);
				if(vout!=-1) {
					// we previously processed an edge  where we came under
					// now we know both endpoints
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else {
				assert(0);
			}
			

			e0=e1;
			e1++; // do the modulo at the beginning of the loop

		} while(e0!=estart) ;
		e0 = enextface;
		if(planeside&UNDER) {
			planeflag[currentplane].undermap = underplanescount;
			tmpunderplanes[underplanescount] = convex.facets[currentplane];
			underplanescount++;
		}
		else {
			planeflag[currentplane].undermap = 0;
		}
		if(vout>=0 && (planeside&UNDER)) {
			assert(vin>=0);
			assert(coplanaredge>=0);
			assert(coplanaredge!=511);
			coplanaredges[coplanaredges_num].ea = coplanaredge;
			coplanaredges[coplanaredges_num].v0 = vin;
			coplanaredges[coplanaredges_num].v1 = vout;
			coplanaredges_num++;
		}
	}

	// add the new plane to the mix:
	if(coplanaredges_num>0) {
		tmpunderplanes[underplanescount++]=slice;
	}
	for(i=0;i<coplanaredges_num-1;i++) {
		if(coplanaredges[i].v1 != coplanaredges[i+1].v0) {
			int j = 0;
			for(j=i+2;j<coplanaredges_num;j++) {
				if(coplanaredges[i].v1 == coplanaredges[j].v0) {
					Coplanar tmp = coplanaredges[i+1];
					coplanaredges[i+1] = coplanaredges[j];
					coplanaredges[j] = tmp;
					break;
				}
			}
			if(j>=coplanaredges_num)
			{
				assert(j<coplanaredges_num);
				return NULL;
			}
		}
	}
	ConvexH *punder = new ConvexH(vertcountunder,under_edge_count+coplanaredges_num,underplanescount);
	ConvexH &under = *punder;
	int k=0;
	for(i=0;i<convex.vertices.count;i++) {
		if(vertflag[i].planetest != OVER){
			under.vertices[k++] = convex.vertices[i];
		}
	}
	i=0;
	while(k<vertcountunder) {
		under.vertices[k++] = createdverts[i++];
	}
	assert(i==createdverts.count);

	for(i=0;i<coplanaredges_num;i++) {
		under.edges[under_edge_count+i].p  = underplanescount-1;
		under.edges[under_edge_count+i].ea = coplanaredges[i].ea;
		tmpunderedges[coplanaredges[i].ea].ea = under_edge_count+i;
		under.edges[under_edge_count+i].v  = coplanaredges[i].v0;
	}
	
	memcpy(under.edges.element,tmpunderedges,sizeof(HalfEdge)*under_edge_count);
	memcpy(under.facets.element,tmpunderplanes,sizeof(Plane)*underplanescount);
	return punder;
}